

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::DecodeCompressed(S2Loop *this,Decoder *decoder,int snap_level)

{
  undefined1 auVar1 [16];
  int level;
  Decoder *decoder_00;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  S2Point *pSVar5;
  Span<Vector3<double>_> points;
  Vector3<double> *local_b0;
  S2LatLngRect local_88;
  uint32 local_5c;
  uint32 unsigned_depth;
  bitset<2UL> properties;
  uint32 properties_uint32;
  uint local_28;
  int local_24;
  uint32 unsigned_num_vertices;
  int snap_level_local;
  Decoder *decoder_local;
  S2Loop *this_local;
  
  local_24 = snap_level;
  _unsigned_num_vertices = decoder;
  decoder_local = (Decoder *)this;
  bVar2 = Decoder::get_varint32(decoder,&local_28);
  if (bVar2) {
    if ((local_28 == 0) || ((uint)FLAGS_s2polygon_decode_max_num_vertices < local_28)) {
      this_local._7_1_ = false;
    }
    else {
      ClearIndex(this);
      if (((this->owns_vertices_ & 1U) != 0) && (this->vertices_ != (S2Point *)0x0)) {
        operator_delete__(this->vertices_);
      }
      this->num_vertices_ = local_28;
      uVar3 = (ulong)this->num_vertices_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
      if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pSVar5 = (S2Point *)operator_new__(uVar4);
      if (uVar3 != 0) {
        local_b0 = pSVar5;
        do {
          Vector3<double>::Vector3(local_b0);
          local_b0 = local_b0 + 1;
        } while (local_b0 != pSVar5 + uVar3);
      }
      decoder_00 = _unsigned_num_vertices;
      level = local_24;
      this->vertices_ = pSVar5;
      this->owns_vertices_ = true;
      points = absl::MakeSpan<Vector3<double>_>(this->vertices_,(long)this->num_vertices_);
      bVar2 = S2DecodePointsCompressed(decoder_00,level,points);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bVar2 = Decoder::get_varint32
                          (_unsigned_num_vertices,
                           (uint32 *)((long)&properties.super__Base_bitset<1UL>._M_w + 4));
        if (bVar2) {
          std::bitset<2UL>::bitset
                    ((bitset<2UL> *)&stack0xffffffffffffffa8,
                     (ulong)properties.super__Base_bitset<1UL>._M_w._4_4_);
          bVar2 = std::bitset<2UL>::test((bitset<2UL> *)&stack0xffffffffffffffa8,0);
          this->origin_inside_ = bVar2;
          bVar2 = Decoder::get_varint32(_unsigned_num_vertices,&local_5c);
          if (bVar2) {
            this->depth_ = local_5c;
            bVar2 = std::bitset<2UL>::test((bitset<2UL> *)&stack0xffffffffffffffa8,1);
            if (bVar2) {
              bVar2 = S2LatLngRect::Decode(&this->bound_,_unsigned_num_vertices);
              if (!bVar2) {
                return false;
              }
              S2LatLngRectBounder::ExpandForSubregions(&local_88,&this->bound_);
              S2LatLngRect::operator=(&this->subregion_bound_,&local_88);
              S2LatLngRect::~S2LatLngRect(&local_88);
            }
            else {
              InitBound(this);
            }
            InitIndex(this);
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool S2Loop::DecodeCompressed(Decoder* decoder, int snap_level) {
  // get_varint32 takes a uint32*, but num_vertices_ is signed.
  // Decode to a temporary variable to avoid reinterpret_cast.
  uint32 unsigned_num_vertices;
  if (!decoder->get_varint32(&unsigned_num_vertices)) {
    return false;
  }
  if (unsigned_num_vertices == 0 ||
      unsigned_num_vertices > FLAGS_s2polygon_decode_max_num_vertices) {
    return false;
  }
  ClearIndex();
  if (owns_vertices_) delete[] vertices_;
  num_vertices_ = unsigned_num_vertices;
  vertices_ = new S2Point[num_vertices_];
  owns_vertices_ = true;

  if (!S2DecodePointsCompressed(decoder, snap_level,
                                MakeSpan(vertices_, num_vertices_))) {
    return false;
  }
  uint32 properties_uint32;
  if (!decoder->get_varint32(&properties_uint32)) {
    return false;
  }
  const std::bitset<kNumProperties> properties(properties_uint32);
  origin_inside_ = properties.test(kOriginInside);

  uint32 unsigned_depth;
  if (!decoder->get_varint32(&unsigned_depth)) {
    return false;
  }
  depth_ = unsigned_depth;

  if (properties.test(kBoundEncoded)) {
    if (!bound_.Decode(decoder)) {
      return false;
    }
    subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
  } else {
    InitBound();
  }
  InitIndex();
  return true;
}